

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerator::InfoT::GetStringConfig(InfoT *this,string *key,string *value,bool required)

{
  bool bVar1;
  bool bVar2;
  Value *this_00;
  byte unaff_R13B;
  string_view key_00;
  string_view message;
  string_view message_00;
  string configKey;
  string local_d0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  key_00._M_str = (key->_M_dataplus)._M_p;
  key_00._M_len = key->_M_string_length;
  ConfigKey_abi_cxx11_(&local_b0,this,key_00);
  this_00 = Json::Value::operator[](&this->Json_,&local_b0);
  bVar1 = Json::Value::isNull(this_00);
  if (!bVar1) {
    bVar2 = Json::Value::isString(this_00);
    if (bVar2) {
      Json::Value::asString_abi_cxx11_((String *)&local_90,this_00);
      std::__cxx11::string::operator=((string *)value,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      unaff_R13B = 1;
      if ((!required) || (value->_M_string_length != 0)) goto LAB_003b957b;
      local_90.View_._M_len = local_b0._M_string_length;
      local_90.View_._M_str = local_b0._M_dataplus._M_p;
      local_60.View_._M_len = 10;
      local_60.View_._M_str = " is empty.";
      cmStrCat<>(&local_d0,&local_90,&local_60);
      message._M_str = local_d0._M_dataplus._M_p;
      message._M_len = local_d0._M_string_length;
      LogError(this,message);
    }
    else {
      local_90.View_._M_len = local_b0._M_string_length;
      local_90.View_._M_str = local_b0._M_dataplus._M_p;
      local_60.View_._M_len = 0x11;
      local_60.View_._M_str = " is not a string.";
      cmStrCat<>(&local_d0,&local_90,&local_60);
      message_00._M_str = local_d0._M_dataplus._M_p;
      message_00._M_len = local_d0._M_string_length;
      LogError(this,message_00);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    unaff_R13B = 0;
  }
LAB_003b957b:
  std::__cxx11::string::~string((string *)&local_b0);
  if (bVar1) {
    unaff_R13B = GetString(this,key,value,required);
  }
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetStringConfig(std::string const& key,
                                               std::string& value,
                                               bool required) const
{
  { // Try config
    std::string const configKey = this->ConfigKey(key);
    Json::Value const& jval = this->Json_[configKey];
    if (!jval.isNull()) {
      if (!jval.isString()) {
        return this->LogError(cmStrCat(configKey, " is not a string."));
      }
      value = jval.asString();
      if (required && value.empty()) {
        return this->LogError(cmStrCat(configKey, " is empty."));
      }
      return true;
    }
  }
  // Try plain
  return this->GetString(key, value, required);
}